

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_ar.c
# Opt level: O1

uint64_t ar_atol10(char *p,uint char_cnt)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  uint64_t uVar4;
  bool bVar5;
  
  pcVar1 = p + char_cnt;
  while( true ) {
    if ((*p != ' ') && (*p != '\t')) goto LAB_0041c33c;
    bVar5 = char_cnt == 0;
    char_cnt = char_cnt - 1;
    if (bVar5) break;
    p = p + 1;
  }
  char_cnt = 0xffffffff;
  p = pcVar1;
LAB_0041c33c:
  uVar2 = (int)*p - 0x30;
  if (9 < uVar2 || *p < '0') {
    return 0;
  }
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    if (char_cnt == (uint)lVar3) {
      return uVar4;
    }
    if (0x1999999999999999 < uVar4) {
      return 0xffffffffffffffff;
    }
    if (uVar4 == 0x1999999999999999 && 5 < uVar2) {
      return 0xffffffffffffffff;
    }
    uVar4 = (ulong)uVar2 + uVar4 * 10;
    if (p[lVar3 + 1] < 0x30) break;
    uVar2 = (int)p[lVar3 + 1] - 0x30;
    lVar3 = lVar3 + 1;
    if (9 < uVar2) {
      return uVar4;
    }
  }
  return uVar4;
}

Assistant:

static uint64_t
ar_atol10(const char *p, unsigned char_cnt)
{
	uint64_t l, limit, last_digit_limit;
	unsigned int base, digit;

	base = 10;
	limit = UINT64_MAX / base;
	last_digit_limit = UINT64_MAX % base;

	while ((*p == ' ' || *p == '\t') && char_cnt-- > 0)
		p++;
	l = 0;
	digit = *p - '0';
	while (*p >= '0' && digit < base  && char_cnt-- > 0) {
		if (l > limit || (l == limit && digit > last_digit_limit)) {
			l = UINT64_MAX; /* Truncate on overflow. */
			break;
		}
		l = (l * base) + digit;
		digit = *++p - '0';
	}
	return (l);
}